

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.h
# Opt level: O1

bool __thiscall Expression::evaluateInteger<signed_char>(Expression *this,char *dest)

{
  ExpressionInternal *this_00;
  bool bVar1;
  ExpressionValue value;
  ExpressionValue local_40;
  
  this_00 = (this->expression).super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 == (ExpressionInternal *)0x0) {
    bVar1 = false;
  }
  else {
    ExpressionInternal::evaluate(&local_40,this_00);
    bVar1 = local_40.type == Integer;
    if (bVar1) {
      *dest = local_40.field_1.intValue._0_1_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.strValue._value._M_dataplus._M_p != &local_40.strValue._value.field_2) {
      operator_delete(local_40.strValue._value._M_dataplus._M_p,
                      local_40.strValue._value.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool evaluateInteger(T& dest)
	{
		if (expression == nullptr)
			return false;

		ExpressionValue value = expression->evaluate();
		if (value.isInt() == false)
			return false;

		dest = (T) value.intValue;
		return true;
	}